

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O3

_Bool flexfloat_nearest_rounding(flexfloat_t *a,int_fast16_t exp)

{
  _Bool _Var1;
  bool bVar2;
  uint_t uVar3;
  
  _Var1 = flexfloat_round_bit(a,exp);
  if (_Var1) {
    _Var1 = flexfloat_sticky_bit(a,exp);
    bVar2 = true;
    if (!_Var1) {
      if (exp < 1) {
        uVar3 = flexfloat_denorm_frac(a,exp);
        bVar2 = (bool)((byte)uVar3 & 1);
      }
      else {
        bVar2 = (1L << (0x34 - (a->desc).frac_bits & 0x3f) & (ulong)a->value & 0xfffffffffffff) != 0
        ;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool flexfloat_nearest_rounding(const flexfloat_t *a, int_fast16_t exp)
{
    if (flexfloat_round_bit(a, exp))
        if (flexfloat_sticky_bit(a, exp)) // > ulp/2 away
        {
            return 1;
        }
        else // = ulp/2 away, round towards even result, decided by LSB of mantissa
        {
            if (exp <= 0) // denormal
                return flexfloat_denorm_frac(a, exp) & 0x1;
            return flexfloat_frac(a) & 0x1;
        }
    return 0; // < ulp/2 away
}